

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint __val;
  pointer pcVar1;
  double dVar2;
  _func_int **pp_Var3;
  pointer pTVar4;
  FILE *pFVar5;
  pointer pTVar6;
  char cVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int *piVar11;
  size_t sVar12;
  istream *piVar13;
  ulong uVar14;
  long lVar15;
  FILE *pFVar16;
  long lVar17;
  ostream *poVar18;
  uint uVar19;
  long *plVar20;
  char *pcVar21;
  undefined4 in_register_0000003c;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string line;
  DBSQLite db;
  vector<Tle,_std::allocator<Tle>_> results;
  SatLookAngles TLEsAndLAs;
  char local_321;
  FILE *local_320;
  string local_318;
  undefined1 local_2f8 [32];
  DisplayNCurses local_2d8;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  long local_2b8;
  FILE *local_2b0;
  DBSQLite local_2a8;
  ulong local_298;
  ulong local_290;
  vector<Tle,_std::allocator<Tle>_> local_288;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  local_220 [20];
  
  iVar10 = getopt_long(CONCAT44(in_register_0000003c,argc),argv,"ghva:d:r:u:x:y:",opts,0);
  if (iVar10 < 1) {
    local_2b0 = (FILE *)0x0;
    local_2b8 = 0xffffffff;
    local_320 = (FILE *)0x115168;
    local_268 = ZEXT816(0);
    local_258 = ZEXT816(0);
    local_290 = 0;
    local_298 = 0;
    local_248 = ZEXT816(0);
  }
  else {
    local_320 = (FILE *)0x115168;
    local_248 = ZEXT816(0);
    local_2b8 = 0xffffffff;
    local_2b0 = (FILE *)0x0;
    local_298 = 0;
    local_290 = 0;
    local_258 = ZEXT816(0);
    local_268 = ZEXT816(0);
    do {
      if (iVar10 - 0x72U < 8) {
        switch(iVar10) {
        case 0x72:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_318);
          pp_Var3 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar11 = __errno_location();
          iVar10 = *piVar11;
          *piVar11 = 0;
          lVar15 = strtol((char *)pp_Var3,(char **)&local_2d8,10);
          if (local_2d8.super_Display._vptr_Display != pp_Var3) {
            local_2b8 = lVar15;
            if (((int)lVar15 == lVar15) && (*piVar11 != 0x22)) {
              if (*piVar11 == 0) goto LAB_001080ce;
              goto LAB_001080d1;
            }
LAB_00108c8a:
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_00108ca2:
          std::__throw_invalid_argument("stod");
LAB_00108cae:
          poVar18 = std::operator<<((ostream *)&std::cerr,"[-] Unknown command line option.");
          std::endl<char,std::char_traits<char>>(poVar18);
          exit(1);
        default:
          goto LAB_00108cae;
        case 0x75:
          local_2b0 = _optarg;
          break;
        case 0x76:
          local_290 = CONCAT71((int7)((ulong)(&DAT_00115070 +
                                             *(int *)(&DAT_00115070 + (ulong)(iVar10 - 0x72U) * 4))
                                     >> 8),1);
          break;
        case 0x78:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_318);
          pp_Var3 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar11 = __errno_location();
          iVar10 = *piVar11;
          *piVar11 = 0;
          dVar2 = strtod((char *)pp_Var3,(char **)&local_2d8);
          local_268._8_4_ = extraout_XMM0_Dc_01;
          local_268._0_8_ = dVar2;
          local_268._12_4_ = extraout_XMM0_Dd_01;
          if (local_2d8.super_Display._vptr_Display == pp_Var3) {
LAB_00108c7e:
            std::__throw_invalid_argument("stod");
            goto LAB_00108c8a;
          }
          if (*piVar11 == 0) {
LAB_001080ce:
            *piVar11 = iVar10;
          }
          else if (*piVar11 == 0x22) {
LAB_00108cdf:
            std::__throw_out_of_range("stod");
            goto LAB_00108ceb;
          }
          goto LAB_001080d1;
        case 0x79:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_318);
          pp_Var3 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar11 = __errno_location();
          iVar10 = *piVar11;
          *piVar11 = 0;
          dVar2 = strtod((char *)pp_Var3,(char **)&local_2d8);
          if (local_2d8.super_Display._vptr_Display == pp_Var3) {
            std::__throw_invalid_argument("stod");
            goto LAB_00108c7e;
          }
          local_258._8_4_ = extraout_XMM0_Dc_00;
          local_258._0_8_ = dVar2;
          local_258._12_4_ = extraout_XMM0_Dd_00;
          if (*piVar11 == 0) goto LAB_001080ce;
          if (*piVar11 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_00108cdf;
          }
LAB_001080d1:
          if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),
                            local_238._16_8_ + 1);
          }
        }
      }
      else {
        if (7 < iVar10 - 0x61U) goto LAB_00108cae;
        switch(iVar10) {
        case 0x61:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_318);
          pp_Var3 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar11 = __errno_location();
          iVar10 = *piVar11;
          *piVar11 = 0;
          dVar2 = strtod((char *)pp_Var3,(char **)&local_2d8);
          local_248._8_4_ = extraout_XMM0_Dc;
          local_248._0_8_ = dVar2;
          local_248._12_4_ = extraout_XMM0_Dd;
          if (local_2d8.super_Display._vptr_Display == pp_Var3) goto LAB_00108ca2;
          if (*piVar11 == 0) goto LAB_001080ce;
          if (*piVar11 != 0x22) goto LAB_001080d1;
LAB_00108ceb:
          std::__throw_out_of_range("stod");
          goto LAB_00108cf7;
        default:
          goto LAB_00108cae;
        case 100:
          local_320 = _optarg;
          break;
        case 0x67:
          local_298 = CONCAT71((int7)((ulong)(&DAT_00115050 +
                                             *(int *)(&DAT_00115050 + (ulong)(iVar10 - 0x61U) * 4))
                                     >> 8),1);
          break;
        case 0x68:
          usage(*argv);
        }
      }
      iVar10 = getopt_long(argc,argv,"ghva:d:r:u:x:y:",opts,0);
    } while (0 < iVar10);
  }
  if ((90.0 < ABS((double)local_268._0_8_)) || (180.0 < ABS((double)local_258._0_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[-] Invalid coordinates (latitude: ",0x23);
    poVar18 = std::ostream::_M_insert<double>((double)local_268._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", longitude: ",0xd);
    poVar18 = std::ostream::_M_insert<double>((double)local_258._0_8_);
    local_238[0] = (string)0x29;
    plVar20 = (long *)std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_238,1);
    lVar15 = *plVar20;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[+] Using viewer position (latitude: ",0x25);
    poVar18 = std::ostream::_M_insert<double>((double)local_268._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", longitude: ",0xd);
    poVar18 = std::ostream::_M_insert<double>((double)local_258._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,", altitude: ",0xc);
    poVar18 = std::ostream::_M_insert<double>((double)local_248._0_8_);
    local_238[0] = (string)0x29;
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_238,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    pFVar16 = local_320;
    if (local_320 != (FILE *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[+] Using database: ",0x14);
      sVar12 = strlen((char *)pFVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)pFVar16,sVar12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      DBSQLite::DBSQLite(&local_2a8,(char *)pFVar16);
      bVar8 = DBSQLite::ok(&local_2a8);
      pFVar5 = local_2b0;
      iVar10 = (int)local_2b8;
      if (bVar8) {
        if (local_2b0 != (FILE *)0x0) {
          iVar10 = (*local_2a8.super_DB._vptr_DB[2])();
          if ((char)iVar10 == '\0') {
LAB_00108cf7:
            __assert_fail("sourceFile && db.ok() && \"Invalid input to update.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/main.cc"
                          ,0xb8,"void update(const char *, DB &, bool)");
          }
          local_2d8.super_Display._vptr_Display = (_func_int **)&local_2c8;
          local_2d8._refreshSecs = 0;
          local_2d8._12_4_ = 0;
          local_2c8 = 0;
          std::ifstream::ifstream((istream *)local_238,(char *)pFVar5,_S_in);
          local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          while( true ) {
            cVar9 = std::ios::widen((char)*(undefined8 *)
                                           (CONCAT71(local_238._1_7_,local_238[0]) + -0x18) +
                                    (char)(istream *)local_238);
            piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_2d8,cVar9);
            pTVar6 = local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar4 = local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
            uVar14 = std::__cxx11::string::find_first_not_of((char *)&local_2d8,0x11576d,0);
            if (((uVar14 != 0xffffffffffffffff) &&
                (lVar15 = std::__cxx11::string::find_last_not_of
                                    ((char *)&local_2d8,0x11576c,0xffffffffffffffff), lVar15 != -1))
               && (lVar15 + 1U != uVar14 &&
                   *(char *)((long)local_2d8.super_Display._vptr_Display + uVar14) != '#')) {
              std::__cxx11::string::find_first_of((char *)&local_2d8,0x11576c,uVar14);
              std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"[+] Loading TLEs from \'",0x17);
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_318._M_dataplus._M_p,
                                   CONCAT44(local_318._M_string_length._4_4_,
                                            (uint)local_318._M_string_length));
              local_2f8[0] = 0x27;
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_2f8,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
              std::ostream::put((char)poVar18);
              std::ostream::flush();
              lVar15 = std::__cxx11::string::find((char *)&local_318,0x1157f9,0);
              if ((lVar15 == -1) &&
                 (pFVar16 = fopen(local_318._M_dataplus._M_p,"r"), pFVar16 != (FILE *)0x0)) {
                readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_2f8,&local_318,(FILE *)pFVar16);
                std::vector<Tle,std::allocator<Tle>>::
                _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>>
                          ((vector<Tle,std::allocator<Tle>> *)&local_288,
                           local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                           super__Vector_impl_data._M_finish,local_2f8._0_8_,local_2f8._8_8_);
                fclose(pFVar16);
                std::vector<Tle,_std::allocator<Tle>_>::~vector
                          ((vector<Tle,_std::allocator<Tle>_> *)local_2f8);
              }
              else {
                lVar15 = curl_easy_init();
                if (((lVar15 != 0) &&
                    ((iVar10 = curl_easy_setopt(lVar15,0x2712,local_318._M_dataplus._M_p),
                     iVar10 == 0 &&
                     (lVar17 = std::__cxx11::string::find((char *)&local_318,0x1157f9,0),
                     lVar17 != -1)))) && (local_320 = tmpfile(), local_320 != (FILE *)0x0)) {
                  iVar10 = curl_easy_setopt(lVar15,0x2711,local_320);
                  if (iVar10 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"[+] Downloading contents from ",0x1e);
                    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,local_318._M_dataplus._M_p,
                                         CONCAT44(local_318._M_string_length._4_4_,
                                                  (uint)local_318._M_string_length));
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18)
                    ;
                    std::ostream::put((char)poVar18);
                    std::ostream::flush();
                    iVar10 = curl_easy_perform(lVar15);
                    curl_easy_cleanup(lVar15);
                    pFVar16 = local_320;
                    rewind(local_320);
                    readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_2f8,&local_318,
                             (FILE *)pFVar16);
                    std::vector<Tle,std::allocator<Tle>>::
                    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>>
                              ((vector<Tle,std::allocator<Tle>> *)&local_288,
                               local_288.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                               super__Vector_impl_data._M_finish,local_2f8._0_8_,local_2f8._8_8_);
                    fclose(local_320);
                    std::vector<Tle,_std::allocator<Tle>_>::~vector
                              ((vector<Tle,_std::allocator<Tle>_> *)local_2f8);
                    if (iVar10 == 0) goto LAB_00108623;
                  }
                  else {
                    fclose(local_320);
                    curl_easy_cleanup(lVar15);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"[-] Unknown entry in ",0x15);
                pFVar16 = local_2b0;
                sVar12 = strlen((char *)local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)pFVar16,sVar12);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Line ",6)
                ;
                poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
                std::ostream::put((char)poVar18);
                std::ostream::flush();
              }
LAB_00108623:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
            }
          }
          for (; pTVar4 != pTVar6; pTVar4 = pTVar4 + 1) {
            (*local_2a8.super_DB._vptr_DB[1])(&local_2a8,pTVar4);
            if ((local_290 & 1) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"[+] Refreshing [",0x10);
              poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              local_318._M_dataplus._M_p._0_1_ = 0x2f;
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18,(char *)&local_318,1);
              poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]: ",3);
              __val = pTVar4->norad_number_;
              cVar9 = '\x01';
              if (9 < __val) {
                uVar19 = __val;
                cVar7 = '\x04';
                do {
                  cVar9 = cVar7;
                  if (uVar19 < 100) {
                    cVar9 = cVar9 + -2;
                    goto LAB_00108a1e;
                  }
                  if (uVar19 < 1000) {
                    cVar9 = cVar9 + -1;
                    goto LAB_00108a1e;
                  }
                  if (uVar19 < 10000) goto LAB_00108a1e;
                  bVar8 = 99999 < uVar19;
                  uVar19 = uVar19 / 10000;
                  cVar7 = cVar9 + '\x04';
                } while (bVar8);
                cVar9 = cVar9 + '\x01';
              }
LAB_00108a1e:
              local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_318,cVar9);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_318._M_dataplus._M_p,(uint)local_318._M_string_length,__val);
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18,local_318._M_dataplus._M_p,
                                   CONCAT44(local_318._M_string_length._4_4_,
                                            (uint)local_318._M_string_length));
              std::__ostream_insert<char,std::char_traits<char>>(poVar18," (",2);
              local_2f8._0_8_ = local_2f8 + 0x10;
              pcVar1 = (pTVar4->name_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2f8,pcVar1,pcVar1 + (pTVar4->name_)._M_string_length);
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18,(char *)local_2f8._0_8_,local_2f8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
              iVar10 = (*local_2a8.super_DB._vptr_DB[2])(&local_2a8);
              pcVar21 = "Failed";
              if ((byte)iVar10 != 0) {
                pcVar21 = "Good";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,pcVar21,(ulong)(byte)((byte)iVar10 ^ 1) * 2 + 4);
              local_321 = ']';
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,&local_321,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
              std::ostream::put((char)poVar18);
              std::ostream::flush();
              if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                operator_delete((void *)local_2f8._0_8_,
                                (ulong)((long)&(((string *)local_2f8._16_8_)->_M_dataplus)._M_p + 1)
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
            }
          }
          std::vector<Tle,_std::allocator<Tle>_>::~vector(&local_288);
          std::ifstream::~ifstream(local_238);
          if (local_2d8.super_Display._vptr_Display != (_func_int **)&local_2c8) {
            operator_delete(local_2d8.super_Display._vptr_Display,CONCAT71(uStack_2c7,local_2c8) + 1
                           );
          }
          iVar10 = (int)local_2b8;
        }
        getSatellitesAndLookAngles
                  ((SatLookAngles *)local_238,(double)local_268._0_8_,(double)local_258._0_8_,
                   (double)local_248._0_8_,&local_2a8.super_DB);
        if ((local_298 & 1) == 0) {
          local_2d8.super_Display._vptr_Display = (_func_int **)&PTR_render_0011ac00;
          DisplayConsole::render((DisplayConsole *)&local_2d8,(SatLookAngles *)local_238);
        }
        else {
          DisplayNCurses::DisplayNCurses(&local_2d8,iVar10);
          DisplayNCurses::render(&local_2d8,(SatLookAngles *)local_238);
          DisplayNCurses::~DisplayNCurses(&local_2d8);
        }
        std::
        vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
        ::~vector(local_220);
        iVar10 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[-] Error opening database \'",0x1c);
        sVar12 = strlen((char *)pFVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)pFVar16,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\': ",3);
        DBSQLite::getErrorString_abi_cxx11_((string *)local_238,&local_2a8);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)CONCAT71(local_238._1_7_,local_238[0]),
                             local_238._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),local_238._16_8_ + 1)
          ;
        }
        iVar10 = 1;
      }
      DBSQLite::~DBSQLite(&local_2a8);
      return iVar10;
    }
    plVar20 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[-] The database path must not be empty (see --help).",0x35);
    lVar15 = std::cerr;
  }
  std::ios::widen((char)*(undefined8 *)(lVar15 + -0x18) + (char)plVar20);
  std::ostream::put((char)plVar20);
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc, char **argv) {
  double alt = 0.0, lat = 0.0, lon = 0.0;
  bool verbose = false, gui = false;
  const char *sourceFile = nullptr, *dbFile = DEFAULT_DB_PATH;
  int opt, refreshRate = -1;
  const char *optStr = "ghva:d:r:u:x:y:";
  while ((opt = getopt_long(argc, argv, optStr, opts, nullptr)) > 0) {
    switch (opt) {
#if HAVE_GUI
    case 'g':
      gui = true;
      break;
    case 'r':
      refreshRate = std::stoi(optarg);
      break;
#endif
    case 'h':
      usage(argv[0]);
      break;
    case 'v':
      verbose = true;
      break;
    case 'a':
      alt = std::stod(optarg);
      break;
    case 'd':
      dbFile = optarg;
      break;
    case 'u':
      sourceFile = optarg;
      break;
    case 'x':
      lat = std::stod(optarg);
      break;
    case 'y':
      lon = std::stod(optarg);
      break;
    default:
      std::cerr << "[-] Unknown command line option." << std::endl;
      exit(EXIT_FAILURE);
      break;
    }
  }

  // Ensure we have valid coords.
  if (lat > 90.0 || lat < -90.0 || lon > 180.0 || lon < -180.0) {
    std::cerr << "[-] Invalid coordinates (latitude: " << lat
              << ", longitude: " << lon << ')' << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using viewer position (latitude: " << lat
            << ", longitude: " << lon << ", "
            << ", altitude: " << alt << ')' << std::endl;

  // Open the database that contains the TLE data.
  if (!dbFile) {
    std::cerr << "[-] The database path must not be empty (see --help)."
              << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using database: " << dbFile << std::endl;

  DBSQLite db(dbFile);
  if (!db.ok()) {
    std::cerr << "[-] Error opening database '" << dbFile
              << "': " << db.getErrorString() << std::endl;
    return EXIT_FAILURE;
  }

  // If a source file is specified, then update the existing database.
  if (sourceFile)
    update(sourceFile, db, verbose);

  // Calculate and display.
  auto TLEsAndLAs = getSatellitesAndLookAngles(lat, lon, alt, db);
  if (gui) {
    DisplayNCurses disp(refreshRate);
    disp.render(TLEsAndLAs);
  } else {
    DisplayConsole disp;
    disp.render(TLEsAndLAs);
  }

  return 0;
}